

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

item_accessor * __thiscall
pybind11::detail::object_api<pybind11::handle>::operator[]
          (item_accessor *__return_storage_ptr__,object_api<pybind11::handle> *this,handle key)

{
  handle *phVar1;
  object local_30;
  handle local_28;
  object_api<pybind11::handle> *local_20;
  object_api<pybind11::handle> *this_local;
  handle key_local;
  
  local_20 = this;
  this_local = (object_api<pybind11::handle> *)key.m_ptr;
  key_local.m_ptr = (PyObject *)__return_storage_ptr__;
  phVar1 = derived(this);
  local_28.m_ptr = phVar1->m_ptr;
  reinterpret_borrow<pybind11::object>((pybind11 *)&local_30,(handle)this_local);
  accessor<pybind11::detail::accessor_policies::generic_item>::accessor
            (__return_storage_ptr__,local_28,(key_type *)&local_30);
  object::~object(&local_30);
  return __return_storage_ptr__;
}

Assistant:

item_accessor object_api<D>::operator[](handle key) const {
    return {derived(), reinterpret_borrow<object>(key)};
}